

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::detail::
iteration_proxy<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::iteration_proxy_internal::key(string *__return_storage_ptr__,iteration_proxy_internal *this)

{
  value_t vVar1;
  pointer pbVar2;
  allocator<char> local_9;
  
  pbVar2 = (this->anchor).m_object;
  if (pbVar2 != (pointer)0x0) {
    vVar1 = pbVar2->m_type;
    if (vVar1 == object) {
      iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::key(__return_storage_ptr__,&this->anchor);
    }
    else if (vVar1 == array) {
      Catch::clara::std::__cxx11::to_string((string *)__return_storage_ptr__,this->array_index);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_9);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("anchor.m_object != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/lib/json/include/nlohmann/json.hpp"
                ,0x11b4,
                "std::string nlohmann::detail::iteration_proxy<nlohmann::detail::iter_impl<const nlohmann::basic_json<>>>::iteration_proxy_internal::key() const [IteratorType = nlohmann::detail::iter_impl<const nlohmann::basic_json<>>]"
               );
}

Assistant:

std::string key() const
{
assert(anchor.m_object != nullptr);

switch (anchor.m_object->type())
{
// use integer array index as key
case value_t::array:
return std::to_string(array_index);

// use key from the object
case value_t::object:
return anchor.key();

// use an empty key for all primitive types
default:
return "";
}
}